

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_statistics.cpp
# Opt level: O1

void __thiscall duckdb::ColumnStatistics::Serialize(ColumnStatistics *this,Serializer *serializer)

{
  pointer *__ptr;
  _Head_base<0UL,_duckdb::DistinctStatistics_*,_false> local_18;
  
  Serializer::WriteProperty<duckdb::BaseStatistics>(serializer,100,"statistics",&this->stats);
  local_18._M_head_impl = (DistinctStatistics *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>
            (serializer,0x65,"distinct",&this->distinct_stats,
             (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
              *)&local_18);
  if (local_18._M_head_impl != (DistinctStatistics *)0x0) {
    ::std::default_delete<duckdb::DistinctStatistics>::operator()
              ((default_delete<duckdb::DistinctStatistics> *)&local_18,local_18._M_head_impl);
  }
  return;
}

Assistant:

void ColumnStatistics::Serialize(Serializer &serializer) const {
	serializer.WriteProperty(100, "statistics", stats);
	serializer.WritePropertyWithDefault(101, "distinct", distinct_stats, unique_ptr<DistinctStatistics>());
}